

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavEndFrame(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiNavMoveFlags wanted_flags;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) {
    NavUpdateWindowingOverlay();
  }
  if ((((pIVar1->NavWindow != (ImGuiWindow *)0x0) && (bVar2 = NavMoveRequestButNoResultYet(), bVar2)
       ) && ((pIVar1->NavMoveFlags & 0xfU) != 0)) && ((pIVar1->NavMoveFlags & 0x80U) == 0)) {
    NavUpdateCreateWrappingRequest();
  }
  return;
}

Assistant:

static void ImGui::NavEndFrame()
{
    ImGuiContext& g = *GImGui;

    // Show CTRL+TAB list window
    if (g.NavWindowingTarget != NULL)
        NavUpdateWindowingOverlay();

    // Perform wrap-around in menus
    // FIXME-NAV: Wrap may need to apply a weight bias on the other axis. e.g. 4x4 grid with 2 last items missing on last item won't handle LoopY/WrapY correctly.
    // FIXME-NAV: Wrap (not Loop) support could be handled by the scoring function and then WrapX would function without an extra frame.
    const ImGuiNavMoveFlags wanted_flags = ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX | ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY;
    if (g.NavWindow && NavMoveRequestButNoResultYet() && (g.NavMoveFlags & wanted_flags) && (g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded) == 0)
        NavUpdateCreateWrappingRequest();
}